

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O1

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  float *pfVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  float *ptr;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  
  iVar12 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar8 = bottom_top_blob->h;
  uVar11 = bottom_top_blob->c;
  if (iVar9 == 3) {
    if (0 < (int)uVar11) {
      uVar8 = iVar4 * iVar12 * uVar8;
      pp_Var5 = this->_vptr_PReLU_x86;
      uVar15 = 0;
      do {
        p_Var6 = pp_Var5[-3];
        uVar14 = 0;
        if (1 < *(int *)(&this->field_0xd0 + (long)p_Var6)) {
          uVar14 = uVar15;
        }
        fVar3 = *(float *)(*(long *)(&this->field_0xd8 + (long)p_Var6) + uVar14 * 4);
        fVar20 = fVar3;
        fVar21 = fVar3;
        fVar22 = fVar3;
        fVar23 = fVar3;
        if (1 < *(int *)(&this->field_0xd0 + (long)p_Var6) && iVar12 == 4) {
          pfVar7 = (float *)(*(long *)(&this->field_0xd8 + (long)p_Var6) + uVar15 * 0x10);
          fVar20 = *pfVar7;
          fVar21 = pfVar7[1];
          fVar22 = pfVar7[2];
          fVar23 = pfVar7[3];
        }
        pauVar17 = (undefined1 (*) [16])
                   (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (3 < (int)uVar8) {
          iVar9 = 3;
          do {
            auVar19 = maxps(*pauVar17,ZEXT816(0));
            auVar18 = minps(*pauVar17,ZEXT816(0));
            auVar24._0_4_ = auVar18._0_4_ * fVar20 + auVar19._0_4_;
            auVar24._4_4_ = auVar18._4_4_ * fVar21 + auVar19._4_4_;
            auVar24._8_4_ = auVar18._8_4_ * fVar22 + auVar19._8_4_;
            auVar24._12_4_ = auVar18._12_4_ * fVar23 + auVar19._12_4_;
            *pauVar17 = auVar24;
            pauVar17 = pauVar17 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar8 & 0xfffffffc;
          } while (iVar9 < (int)uVar8);
        }
        if (uVar8 - uVar10 != 0 && (int)uVar10 <= (int)uVar8) {
          lVar13 = 0;
          do {
            if (*(float *)(*pauVar17 + lVar13 * 4) < 0.0) {
              *(float *)(*pauVar17 + lVar13 * 4) = *(float *)(*pauVar17 + lVar13 * 4) * fVar3;
            }
            lVar13 = lVar13 + 1;
          } while (uVar8 - uVar10 != (int)lVar13);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar11);
    }
  }
  else if (iVar9 == 2) {
    if (0 < (int)uVar8) {
      uVar11 = iVar12 * iVar4;
      pp_Var5 = this->_vptr_PReLU_x86;
      uVar15 = 0;
      do {
        p_Var6 = pp_Var5[-3];
        uVar14 = 0;
        if (1 < *(int *)(&this->field_0xd0 + (long)p_Var6)) {
          uVar14 = uVar15;
        }
        fVar3 = *(float *)(*(long *)(&this->field_0xd8 + (long)p_Var6) + uVar14 * 4);
        fVar20 = fVar3;
        fVar21 = fVar3;
        fVar22 = fVar3;
        fVar23 = fVar3;
        if (1 < *(int *)(&this->field_0xd0 + (long)p_Var6) && iVar12 == 4) {
          pfVar7 = (float *)(*(long *)(&this->field_0xd8 + (long)p_Var6) + uVar15 * 0x10);
          fVar20 = *pfVar7;
          fVar21 = pfVar7[1];
          fVar22 = pfVar7[2];
          fVar23 = pfVar7[3];
        }
        pauVar17 = (undefined1 (*) [16])
                   ((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar10 = 0;
        if (3 < (int)uVar11) {
          iVar9 = 3;
          do {
            auVar24 = maxps(*pauVar17,ZEXT816(0));
            auVar18 = minps(*pauVar17,ZEXT816(0));
            auVar19._0_4_ = auVar18._0_4_ * fVar20 + auVar24._0_4_;
            auVar19._4_4_ = auVar18._4_4_ * fVar21 + auVar24._4_4_;
            auVar19._8_4_ = auVar18._8_4_ * fVar22 + auVar24._8_4_;
            auVar19._12_4_ = auVar18._12_4_ * fVar23 + auVar24._12_4_;
            *pauVar17 = auVar19;
            pauVar17 = pauVar17 + 1;
            iVar9 = iVar9 + 4;
            uVar10 = uVar11 & 0xfffffffc;
          } while (iVar9 < (int)uVar11);
        }
        if (uVar11 - uVar10 != 0 && (int)uVar10 <= (int)uVar11) {
          lVar13 = 0;
          do {
            if (*(float *)(*pauVar17 + lVar13 * 4) < 0.0) {
              *(float *)(*pauVar17 + lVar13 * 4) = *(float *)(*pauVar17 + lVar13 * 4) * fVar3;
            }
            lVar13 = lVar13 + 1;
          } while (uVar11 - uVar10 != (int)lVar13);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar8);
    }
  }
  else if (iVar9 == 1) {
    iVar12 = iVar12 * iVar4;
    pp_Var5 = this->_vptr_PReLU_x86;
    p_Var6 = pp_Var5[-3];
    pauVar17 = (undefined1 (*) [16])bottom_top_blob->data;
    pfVar7 = *(float **)(&this->field_0xd8 + (long)p_Var6);
    if (*(int *)(&this->field_0xd0 + (long)p_Var6) < 2) {
      fVar3 = *pfVar7;
      iVar9 = iVar12 + 3;
      if (-1 < iVar12) {
        iVar9 = iVar12;
      }
      if (3 < iVar12) {
        uVar15 = (ulong)(uint)(iVar9 >> 2);
        pauVar16 = pauVar17;
        do {
          auVar19 = maxps(*pauVar16,ZEXT816(0));
          auVar18 = minps(*pauVar16,ZEXT816(0));
          *(float *)*pauVar16 = auVar18._0_4_ * fVar3 + auVar19._0_4_;
          *(float *)(*pauVar16 + 4) = auVar18._4_4_ * fVar3 + auVar19._4_4_;
          *(float *)(*pauVar16 + 8) = auVar18._8_4_ * fVar3 + auVar19._8_4_;
          *(float *)(*pauVar16 + 0xc) = auVar18._12_4_ * fVar3 + auVar19._12_4_;
          pauVar16 = pauVar16 + 1;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      iVar9 = (iVar9 >> 2) * 4;
      if (iVar9 < iVar12) {
        lVar13 = (long)iVar9;
        do {
          if (*(float *)(*pauVar17 + lVar13 * 4) < 0.0) {
            *(float *)(*pauVar17 + lVar13 * 4) = *(float *)(*pauVar17 + lVar13 * 4) * fVar3;
          }
          lVar13 = lVar13 + 1;
        } while (iVar12 != lVar13);
      }
    }
    else {
      iVar9 = iVar12 + 3;
      if (-1 < iVar12) {
        iVar9 = iVar12;
      }
      if (3 < iVar12) {
        uVar15 = (ulong)(uint)(iVar9 >> 2);
        lVar13 = 0;
        do {
          auVar19 = maxps(*(undefined1 (*) [16])(*pauVar17 + lVar13),ZEXT816(0));
          auVar18 = minps(*(undefined1 (*) [16])(*pauVar17 + lVar13),ZEXT816(0));
          pfVar1 = (float *)((long)pfVar7 + lVar13);
          fVar3 = pfVar1[1];
          fVar20 = pfVar1[2];
          fVar21 = pfVar1[3];
          pfVar2 = (float *)(*pauVar17 + lVar13);
          *pfVar2 = auVar18._0_4_ * *pfVar1 + auVar19._0_4_;
          pfVar2[1] = auVar18._4_4_ * fVar3 + auVar19._4_4_;
          pfVar2[2] = auVar18._8_4_ * fVar20 + auVar19._8_4_;
          pfVar2[3] = auVar18._12_4_ * fVar21 + auVar19._12_4_;
          lVar13 = lVar13 + 0x10;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
      }
      iVar9 = (iVar9 >> 2) * 4;
      if (iVar9 < iVar12) {
        lVar13 = (long)iVar9;
        do {
          if (*(float *)(*pauVar17 + lVar13 * 4) < 0.0) {
            *(float *)(*pauVar17 + lVar13 * 4) =
                 *(float *)(*pauVar17 + lVar13 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var5[-3]) + lVar13 * 4);
          }
          lVar13 = lVar13 + 1;
        } while (iVar12 != lVar13);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}